

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_location_formatter<spdlog::details::null_scoped_padder>::format
          (source_location_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_2,memory_buf_t *dest)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  memory_buf_t *dest_00;
  string_view_t view;
  char local_61;
  fmt_helper *local_60;
  null_scoped_padder local_49;
  size_t sStack_48;
  null_scoped_padder p;
  size_t text_size;
  memory_buf_t *pmStack_38;
  null_scoped_padder p_1;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  source_location_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  pmStack_38 = dest;
  bVar1 = source_loc::empty(&msg->source);
  if (bVar1) {
    null_scoped_padder::null_scoped_padder
              ((null_scoped_padder *)((long)&text_size + 7),0,&(this->super_flag_formatter).padinfo_
               ,pmStack_38);
  }
  else {
    bVar1 = padding_info::enabled(&(this->super_flag_formatter).padinfo_);
    if (bVar1) {
      sVar3 = std::char_traits<char>::length((msg->source).filename);
      uVar2 = null_scoped_padder::count_digits<int>((msg->source).line);
      sStack_48 = sVar3 + uVar2 + 1;
    }
    else {
      sStack_48 = 0;
    }
    null_scoped_padder::null_scoped_padder
              (&local_49,sStack_48,&(this->super_flag_formatter).padinfo_,pmStack_38);
    local_60 = (fmt_helper *)(msg->source).filename;
    dest_00 = (memory_buf_t *)std::char_traits<char>::length((char_type *)local_60);
    view.size_ = (size_t)pmStack_38;
    view.data_ = (char *)dest_00;
    fmt_helper::append_string_view(local_60,view,dest_00);
    local_61 = ':';
    fmt::v10::detail::buffer<char>::push_back(&pmStack_38->super_buffer<char>,&local_61);
    fmt_helper::append_int<int>((msg->source).line,pmStack_38);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }

        size_t text_size;
        if (padinfo_.enabled()) {
            // calc text size for padding based on "filename:line"
            text_size = std::char_traits<char>::length(msg.source.filename) +
                        ScopedPadder::count_digits(msg.source.line) + 1;
        } else {
            text_size = 0;
        }

        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.filename, dest);
        dest.push_back(':');
        fmt_helper::append_int(msg.source.line, dest);
    }